

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strtod.cc
# Opt level: O3

double google::protobuf::io::NoLocaleStrtod(char *str,char **endptr)

{
  size_t sVar1;
  from_chars_result fVar2;
  double ret;
  double local_20;
  
  local_20 = 0.0;
  sVar1 = strlen(str);
  fVar2 = absl::lts_20250127::from_chars(str,str + sVar1,&local_20,general);
  if (fVar2.ec == result_out_of_range) {
    if (local_20 <= 1.0) {
      if (local_20 < -1.0) {
        local_20 = -INFINITY;
      }
    }
    else {
      local_20 = INFINITY;
    }
  }
  if (endptr != (char **)0x0) {
    *endptr = fVar2.ptr;
  }
  return local_20;
}

Assistant:

double NoLocaleStrtod(const char *str, char **endptr) {
  double ret = 0.0;
  // This isn't ideal, but the existing function interface does not provide any
  // bounds.
  const char *end = strchr(str, 0);
  auto result = absl::from_chars(str, end, ret);
  // from_chars() with DR 3081's current wording will return max() on
  // overflow.  SimpleAtod returns infinity instead.
  if (result.ec == std::errc::result_out_of_range) {
    if (ret > 1.0) {
      ret = std::numeric_limits<double>::infinity();
    } else if (ret < -1.0) {
      ret = -std::numeric_limits<double>::infinity();
    }
  }
  if (endptr) {
    *endptr = const_cast<char *>(result.ptr);
  }
  return ret;
}